

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float col_00;
  undefined4 in_XMM1_Da;
  float unaff_retaddr;
  float unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  float a_max;
  float thickness_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 closed;
  undefined4 in_stack_ffffffffffffffdc;
  ImVec2 *pIVar2;
  
  if (((in_EDX & 0xff000000) != 0) && (0.0 < in_XMM0_Da)) {
    pIVar2 = in_RDI;
    if (in_ECX < 1) {
      iVar1 = _CalcCircleAutoSegmentCount
                        ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                         ,(float)((ulong)in_RDI >> 0x20));
      closed = (undefined1)((uint)in_stack_ffffffffffffffd8 >> 0x18);
      thickness_00 = (float)((ulong)in_RDI >> 0x20);
    }
    else {
      iVar1 = ImClamp<int>(in_ECX,3,0x200);
      closed = (undefined1)((uint)in_stack_ffffffffffffffd8 >> 0x18);
      thickness_00 = (float)((ulong)in_RDI >> 0x20);
    }
    col_00 = (((float)iVar1 - 1.0) * 6.2831855) / (float)iVar1;
    if (iVar1 == 0xc) {
      PathArcToFast((ImDrawList *)CONCAT44(unaff_retaddr_00,unaff_retaddr),pIVar2,
                    (float)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)in_XMM0_Da);
    }
    else {
      PathArcTo(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                (float)((ulong)pIVar2 >> 0x20),(int)pIVar2);
    }
    PathStroke((ImDrawList *)CONCAT44(iVar1,in_XMM1_Da),(ImU32)col_00,(bool)closed,thickness_00);
  }
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        num_segments = _CalcCircleAutoSegmentCount(radius);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius - 0.5f, 0, 12 - 1);
    else
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, true, thickness);
}